

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_f6f6::AudioState::~AudioState(AudioState *this)

{
  reference pvVar1;
  size_type sVar2;
  pointer pvVar3;
  unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *in_RDI;
  PacketQueue<2097152UL> *in_stack_00000030;
  size_type in_stack_ffffffffffffffd8;
  array<unsigned_int,_40UL> *in_stack_ffffffffffffffe0;
  
  if (*(int *)((long)&in_RDI[0x34]._M_t.
                      super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                      .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl + 4) != 0) {
    alDeleteSources(1,(undefined1 *)
                      ((long)&in_RDI[0x34]._M_t.
                              super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                              .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl + 4));
  }
  pvVar1 = std::array<unsigned_int,_40UL>::operator[]
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (*pvVar1 != 0) {
    sVar2 = std::array<unsigned_int,_40UL>::size((array<unsigned_int,_40UL> *)(in_RDI + 0x35));
    pvVar3 = std::array<unsigned_int,_40UL>::data((array<unsigned_int,_40UL> *)0x10fbf4);
    alDeleteBuffers(sVar2 & 0xffffffff,pvVar3);
  }
  av_freep(in_RDI + 0x21);
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 0x2e));
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI);
  std::unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter>::~unique_ptr
            ((unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter> *)in_RDI);
  std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::~unique_ptr
            ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)in_RDI);
  PacketQueue<2097152UL>::~PacketQueue(in_stack_00000030);
  std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::~unique_ptr(in_RDI);
  return;
}

Assistant:

~AudioState()
    {
        if(mSource)
            alDeleteSources(1, &mSource);
        if(mBuffers[0])
            alDeleteBuffers(static_cast<ALsizei>(mBuffers.size()), mBuffers.data());

        av_freep(&mSamples);
    }